

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O0

string * duckdb::QueryProfiler::JSONSanitize(string *text)

{
  bool bVar1;
  reference pcVar2;
  undefined8 in_RSI;
  string *in_RDI;
  char i;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *result;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  undefined8 local_30;
  undefined1 local_11;
  undefined8 local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  ::std::__cxx11::string::string((string *)in_RDI);
  ::std::__cxx11::string::size();
  ::std::__cxx11::string::reserve((ulong)in_RDI);
  local_30 = local_10;
  local_38._M_current = (char *)::std::__cxx11::string::begin();
  ::std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff98), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_38);
    in_stack_ffffffffffffffa4 = (int)*pcVar2;
    if (in_stack_ffffffffffffffa4 == 8) {
      ::std::__cxx11::string::operator+=((string *)in_RDI,"\\b");
    }
    else if (in_stack_ffffffffffffffa4 == 9) {
      ::std::__cxx11::string::operator+=((string *)in_RDI,"\\t");
    }
    else if (in_stack_ffffffffffffffa4 == 10) {
      ::std::__cxx11::string::operator+=((string *)in_RDI,"\\n");
    }
    else if (in_stack_ffffffffffffffa4 == 0xc) {
      ::std::__cxx11::string::operator+=((string *)in_RDI,"\\f");
    }
    else if (in_stack_ffffffffffffffa4 == 0xd) {
      ::std::__cxx11::string::operator+=((string *)in_RDI,"\\r");
    }
    else if (in_stack_ffffffffffffffa4 == 0x22) {
      ::std::__cxx11::string::operator+=((string *)in_RDI,"\\\"");
    }
    else if (in_stack_ffffffffffffffa4 == 0x5c) {
      ::std::__cxx11::string::operator+=((string *)in_RDI,"\\\\");
    }
    else {
      ::std::__cxx11::string::operator+=((string *)in_RDI,*pcVar2);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_38);
  }
  return in_RDI;
}

Assistant:

string QueryProfiler::JSONSanitize(const std::string &text) {
	string result;
	result.reserve(text.size());
	for (char i : text) {
		switch (i) {
		case '\b':
			result += "\\b";
			break;
		case '\f':
			result += "\\f";
			break;
		case '\n':
			result += "\\n";
			break;
		case '\r':
			result += "\\r";
			break;
		case '\t':
			result += "\\t";
			break;
		case '"':
			result += "\\\"";
			break;
		case '\\':
			result += "\\\\";
			break;
		default:
			result += i;
			break;
		}
	}
	return result;
}